

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationBasicEventTests.cpp
# Opt level: O2

TestStatus *
vkt::synchronization::anon_unknown_0::multiSubmissionCase
          (TestStatus *__return_storage_ptr__,Context *context)

{
  deUint32 queueFamilyIndex;
  VkResult VVar1;
  int iVar2;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue pVVar3;
  long lVar4;
  allocator<char> local_1e9;
  VkCommandBuffer cmdBuffers [2];
  string local_1c8;
  deUint64 local_1a0;
  RefBase<vk::Handle<(vk::HandleType)10>_> local_198;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_178;
  VkFence fence [2];
  Move<vk::VkCommandBuffer_s_*> ptrCmdBuffer [2];
  Move<vk::Handle<(vk::HandleType)6>_> ptrFence [2];
  VkSubmitInfo submitInfo [2];
  
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  pVVar3 = Context::getUniversalQueue(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  ::vk::createFence(ptrFence,vk,device,0,(VkAllocationCallbacks *)0x0);
  ::vk::createFence(ptrFence + 1,vk,device,0,(VkAllocationCallbacks *)0x0);
  fence[0].m_internal =
       ptrFence[0].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal;
  fence[1].m_internal =
       ptrFence[1].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)submitInfo,vk,device,2,queueFamilyIndex,
             (VkAllocationCallbacks *)0x0);
  local_1a0 = ptrFence[1].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal;
  local_178.m_data.deleter.m_device = (VkDevice)submitInfo[0]._16_8_;
  local_178.m_data.deleter.m_allocator = (VkAllocationCallbacks *)submitInfo[0].pWaitSemaphores;
  local_178.m_data.object.m_internal = submitInfo[0]._0_8_;
  local_178.m_data.deleter.m_deviceIface = (DeviceInterface *)submitInfo[0].pNext;
  submitInfo[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo[0]._4_4_ = 0;
  submitInfo[0].pNext = (void *)0x0;
  submitInfo[0].waitSemaphoreCount = 0;
  submitInfo[0]._20_4_ = 0;
  submitInfo[0].pWaitSemaphores = (VkSemaphore *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)submitInfo);
  makeCommandBuffer(ptrCmdBuffer,vk,device,(VkCommandPool)local_178.m_data.object.m_internal);
  makeCommandBuffer(ptrCmdBuffer + 1,vk,device,(VkCommandPool)local_178.m_data.object.m_internal);
  cmdBuffers[0] = ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  cmdBuffers[1] = ptrCmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  memset(submitInfo,0,0x90);
  submitInfo[1].sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo[0].sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo[0].commandBufferCount = 1;
  submitInfo[0].pCommandBuffers = cmdBuffers;
  submitInfo[1].commandBufferCount = submitInfo[0].commandBufferCount;
  submitInfo[1].pCommandBuffers = cmdBuffers + 1;
  ::vk::createEvent((Move<vk::Handle<(vk::HandleType)10>_> *)&local_1c8,vk,device,0,
                    (VkAllocationCallbacks *)0x0);
  local_198.m_data.deleter.m_device = (VkDevice)local_1c8.field_2._M_allocated_capacity;
  local_198.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_1c8.field_2._8_8_;
  local_198.m_data.object.m_internal = (deUint64)local_1c8._M_dataplus._M_p;
  local_198.m_data.deleter.m_deviceIface = (DeviceInterface *)local_1c8._M_string_length;
  local_1c8._M_dataplus._M_p = (pointer)0x0;
  local_1c8._M_string_length = 0;
  local_1c8.field_2._M_allocated_capacity = 0;
  local_1c8.field_2._8_8_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)10>_> *)&local_1c8);
  beginCommandBuffer(vk,cmdBuffers[0]);
  (*vk->_vptr_DeviceInterface[0x6a])(vk,cmdBuffers[0],local_198.m_data.object.m_internal,1);
  endCommandBuffer(vk,cmdBuffers[0]);
  beginCommandBuffer(vk,cmdBuffers[1]);
  (*vk->_vptr_DeviceInterface[0x6c])(vk,cmdBuffers[1],1,&local_198,1,0x10000,0,0,0,0,0,0);
  endCommandBuffer(vk,cmdBuffers[1]);
  VVar1 = (*vk->_vptr_DeviceInterface[2])
                    (vk,pVVar3,1,submitInfo,
                     ptrFence[0].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.
                     m_internal);
  ::vk::checkResult(VVar1,"vk.queueSubmit(queue, 1u, &submitInfo[SET], fence[SET])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicEventTests.cpp"
                    ,0x106);
  VVar1 = (*vk->_vptr_DeviceInterface[2])(vk,pVVar3,1,submitInfo + 1,local_1a0);
  ::vk::checkResult(VVar1,"vk.queueSubmit(queue, 1u, &submitInfo[WAIT], fence[WAIT])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicEventTests.cpp"
                    ,0x107);
  iVar2 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,2,fence,1,0xffffffffffffffff);
  if (iVar2 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,"Wait and set even on device multi submission tests pass",
               &local_1e9);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_1c8);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,"Queue should end execution",&local_1e9);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_1c8);
  }
  std::__cxx11::string::~string((string *)&local_1c8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::~RefBase(&local_198);
  lVar4 = 0x20;
  do {
    ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
              ((RefBase<vk::VkCommandBuffer_s_*> *)
               ((long)&ptrCmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object + lVar4)
              );
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_178);
  lVar4 = 0x20;
  do {
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)6>_> *)
               ((long)&ptrFence[0].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.
                       m_internal + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus multiSubmissionCase (Context& context)
{
	enum {SET=0, WAIT, COUNT};
	const DeviceInterface&			vk					= context.getDeviceInterface();
	const VkDevice					device				= context.getDevice();
	const VkQueue					queue				= context.getUniversalQueue();
	const deUint32					queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	const Move<VkFence>				ptrFence[COUNT]		=
	{
		createFence(vk, device),
		createFence(vk, device)
	};
	VkFence							fence[COUNT]		= {*ptrFence[SET], *ptrFence[WAIT]};
	const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Move<VkCommandBuffer>		ptrCmdBuffer[COUNT]	= {makeCommandBuffer(vk, device, *cmdPool), makeCommandBuffer(vk, device, *cmdPool)};
	VkCommandBuffer					cmdBuffers[COUNT]	= {*ptrCmdBuffer[SET], *ptrCmdBuffer[WAIT]};
	const VkSubmitInfo				submitInfo[COUNT]	=
														{
															{
																VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType				sType;
																DE_NULL,						// const void*					pNext;
																0u,								// deUint32						waitSemaphoreCount;
																DE_NULL,						// const VkSemaphore*			pWaitSemaphores;
																DE_NULL,						// const VkPipelineStageFlags*	pWaitDstStageMask;
																1u,								// deUint32						commandBufferCount;
																&cmdBuffers[SET],				// const VkCommandBuffer*		pCommandBuffers;
																0u,								// deUint32						signalSemaphoreCount;
																DE_NULL,						// const VkSemaphore*			pSignalSemaphores;
															},
															{
																VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType				sType;
																DE_NULL,						// const void*					pNext;
																0u,								// deUint32						waitSemaphoreCount;
																DE_NULL,						// const VkSemaphore*			pWaitSemaphores;
																DE_NULL,						// const VkPipelineStageFlags*	pWaitDstStageMask;
																1u,								// deUint32						commandBufferCount;
																&cmdBuffers[WAIT],				// const VkCommandBuffer*		pCommandBuffers;
																0u,								// deUint32						signalSemaphoreCount;
																DE_NULL,						// const VkSemaphore*			pSignalSemaphores;
															}
														};
	const Unique<VkEvent>			event				(createEvent(vk, device));

	beginCommandBuffer(vk, cmdBuffers[SET]);
	vk.cmdSetEvent(cmdBuffers[SET], *event, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT);
	endCommandBuffer(vk, cmdBuffers[SET]);

	beginCommandBuffer(vk, cmdBuffers[WAIT]);
	vk.cmdWaitEvents(cmdBuffers[WAIT], 1u, &event.get(), VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_ALL_COMMANDS_BIT, 0u, DE_NULL, 0u, DE_NULL, 0u, DE_NULL);
	endCommandBuffer(vk, cmdBuffers[WAIT]);

	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo[SET], fence[SET]));
	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo[WAIT], fence[WAIT]));

	if (VK_SUCCESS != vk.waitForFences(device, 2u, fence, DE_TRUE, LONG_FENCE_WAIT))
		return tcu::TestStatus::fail("Queue should end execution");

	return tcu::TestStatus::pass("Wait and set even on device multi submission tests pass");
}